

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int lyp_precompile_pattern(ly_ctx *ctx,char *pattern,pcre **pcre_cmp,pcre_extra **pcre_std)

{
  int iVar1;
  undefined8 uVar2;
  long local_38;
  char *err_msg;
  pcre_extra **pcre_std_local;
  pcre **pcre_cmp_local;
  char *pattern_local;
  ly_ctx *ctx_local;
  
  local_38 = 0;
  err_msg = (char *)pcre_std;
  pcre_std_local = (pcre_extra **)pcre_cmp;
  pcre_cmp_local = (pcre **)pattern;
  pattern_local = (char *)ctx;
  iVar1 = lyp_check_pattern(ctx,pattern,pcre_cmp);
  if (iVar1 == 0) {
    if ((err_msg != (char *)0x0) && (pcre_std_local != (pcre_extra **)0x0)) {
      uVar2 = pcre_study(*pcre_std_local,0,&local_38);
      *(undefined8 *)err_msg = uVar2;
      if (local_38 != 0) {
        ly_log((ly_ctx *)pattern_local,LY_LLWRN,LY_SUCCESS,"Studying pattern \"%s\" failed (%s).",
               pcre_cmp_local,local_38);
      }
    }
    ctx_local._4_4_ = 0;
  }
  else {
    ctx_local._4_4_ = 1;
  }
  return ctx_local._4_4_;
}

Assistant:

int
lyp_precompile_pattern(struct ly_ctx *ctx, const char *pattern, pcre** pcre_cmp, pcre_extra **pcre_std)
{
    const char *err_msg = NULL;

    if (lyp_check_pattern(ctx, pattern, pcre_cmp)) {
        return EXIT_FAILURE;
    }

    if (pcre_std && pcre_cmp) {
        (*pcre_std) = pcre_study(*pcre_cmp, 0, &err_msg);
        if (err_msg) {
            LOGWRN(ctx, "Studying pattern \"%s\" failed (%s).", pattern, err_msg);
        }
    }

    return EXIT_SUCCESS;
}